

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int xmlParseDocument(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  xmlParserInputPtr pxVar3;
  setDocumentLocatorSAXFunc p_Var4;
  startDocumentSAXFunc p_Var5;
  xmlParserInputBufferPtr pxVar6;
  externalSubsetSAXFunc p_Var7;
  xmlChar *pxVar8;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return -1;
  }
  pxVar3 = ctxt->input;
  if (pxVar3 == (xmlParserInputPtr)0x0) {
    return -1;
  }
  if (((pxVar3->flags & 0x40) == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
    xmlParserGrow(ctxt);
  }
  xmlCtxtInitializeLate(ctxt);
  if ((ctxt->sax != (_xmlSAXHandler *)0x0) &&
     (p_Var4 = ctxt->sax->setDocumentLocator, p_Var4 != (setDocumentLocatorSAXFunc)0x0)) {
    (*p_Var4)(ctxt->userData,&xmlDefaultSAXLocator);
  }
  xmlDetectEncoding(ctxt);
  pxVar3 = ctxt->input;
  if (*pxVar3->cur == '\0') {
    xmlFatalErr(ctxt,XML_ERR_DOCUMENT_EMPTY,(char *)0x0);
  }
  else {
    if (((pxVar3->flags & 0x40) == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    pxVar8 = ctxt->input->cur;
    if ((((((*pxVar8 == '<') && (pxVar8[1] == '?')) && (pxVar8[2] == 'x')) &&
         ((pxVar8[3] == 'm' && (pxVar8[4] == 'l')))) && ((ulong)pxVar8[5] < 0x21)) &&
       ((0x100002600U >> ((ulong)pxVar8[5] & 0x3f) & 1) != 0)) {
      xmlParseXMLDecl(ctxt);
      xmlSkipBlankChars(ctxt);
    }
    else {
      pxVar8 = xmlCharStrdup("1.0");
      ctxt->version = pxVar8;
      if (pxVar8 == (xmlChar *)0x0) {
        xmlCtxtErrMemory(ctxt);
        return -1;
      }
    }
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
        (p_Var5 = ctxt->sax->startDocument, p_Var5 != (startDocumentSAXFunc)0x0)) &&
       (ctxt->disableSAX == 0)) {
      (*p_Var5)(ctxt->userData);
    }
    if ((((ctxt->myDoc != (xmlDocPtr)0x0) && (ctxt->input != (xmlParserInputPtr)0x0)) &&
        (pxVar6 = ctxt->input->buf, pxVar6 != (xmlParserInputBufferPtr)0x0)) &&
       (iVar2 = pxVar6->compressed, -1 < iVar2)) {
      ctxt->myDoc->compression = iVar2;
    }
    xmlParseMisc(ctxt);
    pxVar3 = ctxt->input;
    if (((pxVar3->flags & 0x40) == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    pxVar8 = ctxt->input->cur;
    if ((((*pxVar8 == '<') && (pxVar8[1] == '!')) &&
        ((pxVar8[2] == 'D' && (((pxVar8[3] == 'O' && (pxVar8[4] == 'C')) && (pxVar8[5] == 'T'))))))
       && (((pxVar8[6] == 'Y' && (pxVar8[7] == 'P')) && (pxVar8[8] == 'E')))) {
      ctxt->inSubset = 1;
      xmlParseDocTypeDecl(ctxt);
      xVar1 = *ctxt->input->cur;
      if (xVar1 == '>') {
        xmlNextChar(ctxt);
      }
      else if (xVar1 == '[') {
        xmlParseInternalSubset(ctxt);
      }
      ctxt->inSubset = 2;
      if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
          (p_Var7 = ctxt->sax->externalSubset, p_Var7 != (externalSubsetSAXFunc)0x0)) &&
         (ctxt->disableSAX == 0)) {
        (*p_Var7)(ctxt->userData,ctxt->intSubName,ctxt->extSubSystem,ctxt->extSubURI);
      }
      ctxt->inSubset = 0;
      xmlCleanSpecialAttr(ctxt);
      xmlParseMisc(ctxt);
    }
    pxVar3 = ctxt->input;
    if (((pxVar3->flags & 0x40) == 0) && ((long)pxVar3->end - (long)pxVar3->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    if (*ctxt->input->cur == '<') {
      xmlParseElement(ctxt);
      xmlParseMisc(ctxt);
      xmlParserCheckEOF(ctxt,XML_ERR_DOCUMENT_END);
    }
    else if (ctxt->wellFormed != 0) {
      xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_DOCUMENT_EMPTY,XML_ERR_FATAL,
                 (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                 "Start tag expected, \'<\' not found\n");
    }
    ctxt->instate = XML_PARSER_EOF;
    xmlFinishDocument(ctxt);
    if (ctxt->wellFormed != 0) {
      return 0;
    }
    ctxt->valid = 0;
  }
  return -1;
}

Assistant:

int
xmlParseDocument(xmlParserCtxtPtr ctxt) {
    if ((ctxt == NULL) || (ctxt->input == NULL))
        return(-1);

    GROW;

    /*
     * SAX: detecting the level.
     */
    xmlCtxtInitializeLate(ctxt);

    if ((ctxt->sax) && (ctxt->sax->setDocumentLocator)) {
        ctxt->sax->setDocumentLocator(ctxt->userData,
                (xmlSAXLocator *) &xmlDefaultSAXLocator);
    }

    xmlDetectEncoding(ctxt);

    if (CUR == 0) {
	xmlFatalErr(ctxt, XML_ERR_DOCUMENT_EMPTY, NULL);
	return(-1);
    }

    GROW;
    if ((CMP5(CUR_PTR, '<', '?', 'x', 'm', 'l')) && (IS_BLANK_CH(NXT(5)))) {

	/*
	 * Note that we will switch encoding on the fly.
	 */
	xmlParseXMLDecl(ctxt);
	SKIP_BLANKS;
    } else {
	ctxt->version = xmlCharStrdup(XML_DEFAULT_VERSION);
        if (ctxt->version == NULL) {
            xmlErrMemory(ctxt);
            return(-1);
        }
    }
    if ((ctxt->sax) && (ctxt->sax->startDocument) && (!ctxt->disableSAX))
        ctxt->sax->startDocument(ctxt->userData);
    if ((ctxt->myDoc != NULL) && (ctxt->input != NULL) &&
        (ctxt->input->buf != NULL) && (ctxt->input->buf->compressed >= 0)) {
	ctxt->myDoc->compression = ctxt->input->buf->compressed;
    }

    /*
     * The Misc part of the Prolog
     */
    xmlParseMisc(ctxt);

    /*
     * Then possibly doc type declaration(s) and more Misc
     * (doctypedecl Misc*)?
     */
    GROW;
    if (CMP9(CUR_PTR, '<', '!', 'D', 'O', 'C', 'T', 'Y', 'P', 'E')) {

	ctxt->inSubset = 1;
	xmlParseDocTypeDecl(ctxt);
	if (RAW == '[') {
	    xmlParseInternalSubset(ctxt);
	} else if (RAW == '>') {
            NEXT;
        }

	/*
	 * Create and update the external subset.
	 */
	ctxt->inSubset = 2;
	if ((ctxt->sax != NULL) && (ctxt->sax->externalSubset != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->externalSubset(ctxt->userData, ctxt->intSubName,
	                              ctxt->extSubSystem, ctxt->extSubURI);
	ctxt->inSubset = 0;

        xmlCleanSpecialAttr(ctxt);

	xmlParseMisc(ctxt);
    }

    /*
     * Time to start parsing the tree itself
     */
    GROW;
    if (RAW != '<') {
        if (ctxt->wellFormed)
            xmlFatalErrMsg(ctxt, XML_ERR_DOCUMENT_EMPTY,
                           "Start tag expected, '<' not found\n");
    } else {
	xmlParseElement(ctxt);

	/*
	 * The Misc part at the end
	 */
	xmlParseMisc(ctxt);

        xmlParserCheckEOF(ctxt, XML_ERR_DOCUMENT_END);
    }

    ctxt->instate = XML_PARSER_EOF;
    xmlFinishDocument(ctxt);

    if (! ctxt->wellFormed) {
	ctxt->valid = 0;
	return(-1);
    }

    return(0);
}